

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetMeanF0
               (double *x,int x_length,double fs,double current_position,double current_f0,
               int fft_size,double window_length_in_time,double *base_time,int base_time_length,
               double *refined_f0,double *refined_score)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ForwardRealFFT *forward_real_fft_00;
  void *pvVar10;
  void *pvVar11;
  double *main_window_00;
  double *diff_window_00;
  double *numerator_i_00;
  void *pvVar12;
  int in_EDX;
  ForwardRealFFT *unaff_RBX;
  int in_EDI;
  int in_R8D;
  double *in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int *in_XMM2_Qa;
  double *in_XMM3_Qa;
  fft_complex *unaff_retaddr;
  fft_complex *in_stack_00000008;
  int number_of_harmonics;
  int j;
  double *numerator_i;
  double *power_spectrum;
  double *diff_window;
  double *main_window;
  int *base_index;
  fft_complex *diff_spectrum;
  fft_complex *main_spectrum;
  ForwardRealFFT forward_real_fft;
  int *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffeb8;
  double in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  double in_stack_fffffffffffffed0;
  int *in_stack_fffffffffffffed8;
  double in_stack_fffffffffffffee0;
  ForwardRealFFT *in_stack_fffffffffffffee8;
  double *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int number_of_harmonics_00;
  undefined4 in_stack_ffffffffffffff00;
  int iVar13;
  int iVar14;
  undefined1 local_b8 [108];
  int local_4c;
  undefined4 in_stack_ffffffffffffffc8;
  
  number_of_harmonics_00 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  local_4c = in_R8D;
  memset(local_b8,0,0x60);
  InitializeForwardRealFFT
            ((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),in_stack_fffffffffffffee8);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDX;
  uVar9 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  forward_real_fft_00 = (ForwardRealFFT *)operator_new__(uVar9);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_EDX;
  uVar9 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar10 = operator_new__(uVar9);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)local_4c;
  uVar9 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar9);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)local_4c;
  uVar9 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  main_window_00 = (double *)operator_new__(uVar9);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)local_4c;
  uVar9 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  diff_window_00 = (double *)operator_new__(uVar9);
  GetBaseIndex(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (int)((ulong)in_stack_fffffffffffffec0 >> 0x20),(double)in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0);
  GetMainWindow(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),(double)in_stack_fffffffffffffec8,
                in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  GetDiffWindow(main_window_00,local_4c,diff_window_00);
  GetSpectra(in_XMM0_Qa,(int)((ulong)in_XMM1_Qa >> 0x20),(int)in_XMM1_Qa,in_XMM2_Qa,
             (double *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),in_XMM3_Qa,in_EDI,unaff_RBX,
             unaff_retaddr,in_stack_00000008);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(in_EDX / 2 + 1);
  uVar9 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  numerator_i_00 = (double *)operator_new__(uVar9);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)(in_EDX / 2 + 1);
  uVar9 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar12 = operator_new__(uVar9);
  for (iVar13 = 0; iVar13 <= in_EDX / 2; iVar13 = iVar13 + 1) {
    *(double *)((long)pvVar12 + (long)iVar13 * 8) =
         *(double *)(&forward_real_fft_00->fft_size + (long)iVar13 * 4) *
         *(double *)((long)pvVar10 + (long)iVar13 * 0x10 + 8) +
         -((double)(&forward_real_fft_00->waveform)[(long)iVar13 * 2] *
          *(double *)((long)pvVar10 + (long)iVar13 * 0x10));
    numerator_i_00[iVar13] =
         *(double *)(&forward_real_fft_00->fft_size + (long)iVar13 * 4) *
         *(double *)(&forward_real_fft_00->fft_size + (long)iVar13 * 4) +
         (double)(&forward_real_fft_00->waveform)[(long)iVar13 * 2] *
         (double)(&forward_real_fft_00->waveform)[(long)iVar13 * 2];
  }
  iVar14 = iVar13;
  iVar8 = MyMinInt((int)(((double)in_XMM0_Qa / 2.0) / (double)in_XMM2_Qa),6);
  FixF0(diff_window_00,numerator_i_00,(int)((ulong)pvVar12 >> 0x20),(double)CONCAT44(iVar14,iVar8),
        (double)CONCAT44(iVar13,in_stack_ffffffffffffff00),number_of_harmonics_00,
        in_stack_fffffffffffffef0,(double *)in_stack_fffffffffffffee8);
  if (pvVar10 != (void *)0x0) {
    operator_delete__(pvVar10);
  }
  if (diff_window_00 != (double *)0x0) {
    operator_delete__(diff_window_00);
  }
  if (main_window_00 != (double *)0x0) {
    operator_delete__(main_window_00);
  }
  if (pvVar11 != (void *)0x0) {
    operator_delete__(pvVar11);
  }
  if (pvVar12 != (void *)0x0) {
    operator_delete__(pvVar12);
  }
  if (numerator_i_00 != (double *)0x0) {
    operator_delete__(numerator_i_00);
  }
  if (forward_real_fft_00 != (ForwardRealFFT *)0x0) {
    operator_delete__(forward_real_fft_00);
  }
  DestroyForwardRealFFT(forward_real_fft_00);
  return;
}

Assistant:

static void GetMeanF0(const double *x, int x_length, double fs,
    double current_position, double current_f0, int fft_size,
    double window_length_in_time, const double *base_time,
    int base_time_length, double *refined_f0, double *refined_score) {
  ForwardRealFFT forward_real_fft = { 0 };
  InitializeForwardRealFFT(fft_size, &forward_real_fft);
  fft_complex *main_spectrum = new fft_complex[fft_size];
  fft_complex *diff_spectrum = new fft_complex[fft_size];

  int *base_index = new int[base_time_length];
  double *main_window = new double[base_time_length];
  double *diff_window = new double[base_time_length];

  GetBaseIndex(current_position, base_time, base_time_length, fs, base_index);
  GetMainWindow(current_position, base_index, base_time_length, fs,
      window_length_in_time, main_window);
  GetDiffWindow(main_window, base_time_length, diff_window);

  GetSpectra(x, x_length, fft_size, base_index, main_window, diff_window,
      base_time_length, &forward_real_fft, main_spectrum, diff_spectrum);

  double *power_spectrum = new double[fft_size / 2 + 1];
  double *numerator_i = new double[fft_size / 2 + 1];
  for (int j = 0; j <= fft_size / 2; ++j) {
    numerator_i[j] = main_spectrum[j][0] * diff_spectrum[j][1] -
      main_spectrum[j][1] * diff_spectrum[j][0];
    power_spectrum[j] = main_spectrum[j][0] * main_spectrum[j][0] +
      main_spectrum[j][1] * main_spectrum[j][1];
  }

  int number_of_harmonics =
    MyMinInt(static_cast<int>(fs / 2.0 / current_f0), 6);
  FixF0(power_spectrum, numerator_i, fft_size, fs, current_f0,
      number_of_harmonics, refined_f0, refined_score);

  delete[] diff_spectrum;
  delete[] diff_window;
  delete[] main_window;
  delete[] base_index;
  delete[] numerator_i;
  delete[] power_spectrum;
  delete[] main_spectrum;
  DestroyForwardRealFFT(&forward_real_fft);
}